

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::SubroutineFunctionSet
          (SubroutineFunctionSet *this,UniformValueGenerator *generator,size_t count)

{
  pointer this_00;
  bool bVar1;
  Index _index;
  SubroutineFunction local_130;
  allocator_type *__a;
  
  _index.super_LayoutSpecifierBase.occurence.occurence = NONE_SH;
  _index.super_LayoutSpecifierBase.val = 1999999;
  _index.super_LayoutSpecifierBase.numSys = Dec;
  SubroutineFunction::SubroutineFunction(&local_130,generator,_index);
  if (count < 0x7c1f07c1f07c20) {
    std::
    _Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ::_Vector_base((_Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                    *)this,count,__a);
    this_00 = (this->fn).
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (bVar1 = count != 0, count = count - 1, bVar1) {
      SubroutineFunction::SubroutineFunction(this_00,&local_130);
      this_00 = this_00 + 1;
    }
    (this->fn).
    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
    ._M_impl.super__Vector_impl_data._M_finish = this_00;
    SubroutineFunction::~SubroutineFunction(&local_130);
    (this->typeName)._M_dataplus._M_p = (pointer)&(this->typeName).field_2;
    (this->typeName)._M_string_length = 0;
    (this->typeName).field_2._M_local_buf[0] = '\0';
    return;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

SubroutineFunctionSet(UniformValueGenerator& generator, size_t count = 0) : fn(count, SubroutineFunction(generator))
	{
	}